

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall
PrintfTest_DynamicWidth_Test::~PrintfTest_DynamicWidth_Test(PrintfTest_DynamicWidth_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PrintfTest, DynamicWidth) {
  EXPECT_EQ("   42", test_sprintf("%*d", 5, 42));
  EXPECT_EQ("42   ", test_sprintf("%*d", -5, 42));
  EXPECT_THROW_MSG(test_sprintf("%*d", 5.0, 42), format_error,
      "width is not integer");
  EXPECT_THROW_MSG(test_sprintf("%*d"), format_error,
      "argument index out of range");
  EXPECT_THROW_MSG(test_sprintf("%*d", BIG_NUM, 42), format_error,
      "number is too big");
}